

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::ssbo::SSBOLayoutCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,SSBOLayoutCaseInstance *this)

{
  bool bVar1;
  deUint32 descriptorCount;
  int iVar2;
  DataType DVar3;
  int iVar4;
  BufferBlock *pBVar5;
  BufferLayout *pBVar6;
  pointer pBVar7;
  Allocation *pAVar8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  RefDataStorage *pRVar9;
  pointer pBVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  deUint32 queueFamilyIndex;
  uint uVar17;
  VkResult VVar18;
  DataType scalarType;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  DeviceInterface *vkd;
  VkDevice device;
  void *pvVar24;
  undefined8 *puVar25;
  InstanceInterface *pIVar26;
  VkPhysicalDevice pVVar27;
  uint *puVar28;
  deUint64 *pdVar29;
  pointer pSVar30;
  const_iterator cVar31;
  long *plVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  int *piVar38;
  size_type __n;
  uint uVar39;
  int iVar40;
  int iVar41;
  deUint32 *pdVar42;
  int iVar43;
  pointer pBVar44;
  void *ref;
  int iVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  void *pvVar50;
  long lVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  int iVar55;
  ulong uVar56;
  long lVar57;
  pointer pBVar58;
  BlockDataPtr BVar59;
  int local_b1c;
  void *local_af8;
  ulong local_ac0;
  long *local_a90;
  long local_a88;
  long local_a80 [2];
  long *local_a70;
  long local_a68;
  long local_a60 [2];
  long *local_a50;
  pointer local_a48;
  TestLog *local_a40;
  pointer local_a38;
  VkQueue local_a30;
  RefDataStorage *local_a28;
  int local_a1c;
  int local_a18;
  int local_a14;
  int local_a10;
  int local_a0c;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkSubmitInfo submitInfo;
  Move<vk::VkCommandBuffer_s_*> local_970;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptors;
  long local_938;
  long *plStack_930;
  VkPhysicalDeviceType local_928;
  char cStack_924;
  char cStack_923;
  char cStack_922;
  char cStack_921;
  char acStack_920 [8];
  DescriptorPoolBuilder poolBuilder;
  VkDescriptorSetLayout local_8b8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_8b0;
  VkDescriptorPool local_898;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_890;
  Move<vk::Handle<(vk::HandleType)6>_> local_870;
  Move<vk::Handle<(vk::HandleType)16>_> local_850;
  VkDescriptorBufferInfo descriptorInfo;
  DescriptorSetLayoutBuilder setLayoutBuilder;
  Move<vk::Handle<(vk::HandleType)24>_> local_7d0;
  Move<vk::Handle<(vk::HandleType)18>_> local_7b0;
  Move<vk::Handle<(vk::HandleType)14>_> local_790;
  Move<vk::Handle<(vk::HandleType)8>_> local_770;
  DescriptorSetUpdateBuilder setUpdateBuilder;
  VkPhysicalDeviceProperties properties;
  vector<void_*,_std::allocator<void_*>_> mapPtrs;
  ostringstream expected;
  Deleter<vk::Handle<(vk::HandleType)8>_> aDStack_360 [4];
  ios_base local_2f8 [264];
  vector<int,_std::allocator<int>_> bufferSizes;
  ios_base local_180 [264];
  VkCommandBufferBeginInfo cmdBufBeginParams;
  VkDescriptorSetAllocateInfo allocInfo;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_a30 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  createBuffer(&local_770,(this->super_TestInstance).m_context,0x400,0x20);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties,
             (this->super_TestInstance).m_context,
             (VkBuffer)
             local_770.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  uVar12 = properties._0_8_;
  memset(*(void **)(properties._0_8_ + 0x18),0,0x400);
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)*(deUint64 *)(uVar12 + 8),*(VkDeviceSize *)(uVar12 + 0x10),
             0x400);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&setLayoutBuilder);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&poolBuilder);
  local_a50 = (long *)uVar12;
  uVar39 = 0;
  ::vk::DescriptorSetLayoutBuilder::addBinding
            (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  uVar46 = (uint)((ulong)((long)(this->m_interface->m_bufferBlocks).
                                super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_interface->m_bufferBlocks).
                               super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar46) {
    uVar56 = 0;
    uVar39 = 0;
    do {
      pBVar5 = (this->m_interface->m_bufferBlocks).
               super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar56];
      descriptorCount = pBVar5->m_arraySize;
      if ((int)descriptorCount < 1) {
        iVar47 = 1;
        ::vk::DescriptorSetLayoutBuilder::addBinding
                  (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
      }
      else {
        ::vk::DescriptorSetLayoutBuilder::addBinding
                  (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,descriptorCount,0x20,
                   (VkSampler *)0x0);
        iVar47 = pBVar5->m_arraySize;
      }
      uVar39 = uVar39 + iVar47;
      uVar56 = uVar56 + 1;
    } while ((uVar46 & 0x7fffffff) != uVar56);
  }
  ::vk::DescriptorPoolBuilder::addType(&poolBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,uVar39 + 1);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&properties,&setLayoutBuilder,vkd,device,0);
  DStack_8b0.m_device = (VkDevice)properties._16_8_;
  DStack_8b0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_8b8.m_internal._0_4_ = properties.apiVersion;
  local_8b8.m_internal._4_4_ = properties.driverVersion;
  DStack_8b0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&properties,&poolBuilder,vkd,device,1,1);
  DStack_890.m_device = (VkDevice)properties._16_8_;
  DStack_890.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_898.m_internal._0_4_ = properties.apiVersion;
  local_898.m_internal._4_4_ = properties.driverVersion;
  DStack_890.m_deviceIface = (DeviceInterface *)properties._8_8_;
  allocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal._0_4_ = properties.apiVersion;
  allocInfo.descriptorPool.m_internal._4_4_ = properties.driverVersion;
  allocInfo.descriptorSetCount = 1;
  allocInfo.pSetLayouts = &local_8b8;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&properties,vkd,device,&allocInfo);
  local_928 = properties.deviceType;
  cStack_924 = properties.deviceName[0];
  cStack_923 = properties.deviceName[1];
  cStack_922 = properties.deviceName[2];
  cStack_921 = properties.deviceName[3];
  acStack_920[0] = properties.deviceName[4];
  acStack_920[1] = properties.deviceName[5];
  acStack_920[2] = properties.deviceName[6];
  acStack_920[3] = properties.deviceName[7];
  acStack_920[4] = properties.deviceName[8];
  acStack_920[5] = properties.deviceName[9];
  acStack_920[6] = properties.deviceName[10];
  acStack_920[7] = properties.deviceName[0xb];
  local_938._0_4_ = properties.apiVersion;
  local_938._4_4_ = properties.driverVersion;
  plStack_930 = (long *)properties._8_8_;
  descriptorInfo.buffer.m_internal =
       local_770.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorInfo.offset = 0;
  descriptorInfo.range = 0x400;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&setUpdateBuilder);
  __n = (size_type)(int)uVar39;
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            (&descriptors,__n,(allocator_type *)&properties);
  ::vk::DescriptorSetUpdateBuilder::write(&setUpdateBuilder,(int)local_938,(void *)0x0,0);
  anon_unknown_15::computeBufferSizes(&bufferSizes,this->m_interface,this->m_refLayout);
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)uVar39 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  if (uVar39 == 0) {
    pvVar24 = (void *)0x0;
    local_af8 = (void *)0x0;
    pvVar50 = (void *)0x0;
  }
  else {
    uVar56 = __n * 0xc;
    pvVar24 = operator_new(uVar56);
    local_af8 = (void *)((long)pvVar24 + __n * 0xc);
    memset(pvVar24,0,uVar56);
    pvVar50 = (void *)((long)pvVar24 + uVar56);
  }
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    std::vector<void_*,_std::allocator<void_*>_>::resize(&mapPtrs,__n);
    if (uVar39 != 0) {
      lVar51 = 4;
      uVar56 = 0;
      do {
        uVar17 = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar56];
        *(int *)((long)pvVar24 + lVar51 * 2 + -8) = (int)uVar56;
        *(undefined4 *)((long)pvVar24 + lVar51 * 2 + -4) = 0;
        *(uint *)((long)pvVar24 + lVar51 * 2) = uVar17;
        createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,
                     (this->super_TestInstance).m_context,(ulong)uVar17,0x20);
        allocateAndBindMemory
                  ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&expected,
                   (this->super_TestInstance).m_context,(VkBuffer)properties._0_8_,
                   (MemoryRequirement)0x1);
        *(undefined8 *)
         ((long)descriptors.
                super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar51 * 4 + -0x10) = properties._0_8_;
        *(undefined8 *)
         ((long)descriptors.
                super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar51 * 4 + -8) = 0;
        *(ulong *)((long)&((descriptors.
                            super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start)->buffer).m_internal +
                  lVar51 * 4) = (ulong)uVar17;
        mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar56] = *(void **)(_expected + 0x18);
        puVar25 = (undefined8 *)operator_new(0x20);
        puVar25[2] = properties._16_8_;
        puVar25[3] = properties.deviceName._4_8_;
        *puVar25 = properties._0_8_;
        puVar25[1] = properties._8_8_;
        properties.apiVersion = 0;
        properties.driverVersion = 0;
        properties.vendorID = 0;
        properties.deviceID = 0;
        properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
        properties.deviceName[0] = '\0';
        properties.deviceName[1] = '\0';
        properties.deviceName[2] = '\0';
        properties.deviceName[3] = '\0';
        properties.deviceName[4] = '\0';
        properties.deviceName[5] = '\0';
        properties.deviceName[6] = '\0';
        properties.deviceName[7] = '\0';
        properties.deviceName[8] = '\0';
        properties.deviceName[9] = '\0';
        properties.deviceName[10] = '\0';
        properties.deviceName[0xb] = '\0';
        submitInfo.pNext = (void *)0x0;
        submitInfo._0_8_ = puVar25;
        submitInfo.pNext = operator_new(0x20);
        *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
        *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00cef0f0;
        *(undefined8 **)((long)submitInfo.pNext + 0x10) = puVar25;
        *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                    *)&this->m_uniformBuffers,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo
                  );
        if (submitInfo.pNext != (void *)0x0) {
          LOCK();
          piVar38 = (int *)((long)submitInfo.pNext + 8);
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 == 0) {
            submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            submitInfo._4_4_ = 0;
            (**(code **)(*submitInfo.pNext + 0x10))();
          }
          LOCK();
          piVar38 = (int *)((long)submitInfo.pNext + 0xc);
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if ((*piVar38 == 0) && (submitInfo.pNext != (void *)0x0)) {
            (**(code **)(*submitInfo.pNext + 8))();
          }
        }
        plVar32 = (long *)_expected;
        _expected = 0;
        submitInfo.pNext = (void *)0x0;
        submitInfo._0_8_ = plVar32;
        submitInfo.pNext = operator_new(0x20);
        *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
        *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00cf0f58;
        *(long **)((long)submitInfo.pNext + 0x10) = plVar32;
        *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
        std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
        emplace_back<de::SharedPtr<vk::Allocation>>
                  ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                    *)&this->m_uniformAllocs,(SharedPtr<vk::Allocation> *)&submitInfo);
        if (submitInfo.pNext != (void *)0x0) {
          LOCK();
          piVar38 = (int *)((long)submitInfo.pNext + 8);
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if (*piVar38 == 0) {
            submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            submitInfo._4_4_ = 0;
            (**(code **)(*submitInfo.pNext + 0x10))();
          }
          LOCK();
          piVar38 = (int *)((long)submitInfo.pNext + 0xc);
          *piVar38 = *piVar38 + -1;
          UNLOCK();
          if ((*piVar38 == 0) && (submitInfo.pNext != (void *)0x0)) {
            (**(code **)(*submitInfo.pNext + 8))();
          }
        }
        if ((long *)_expected != (long *)0x0) {
          (**(code **)(*(long *)_expected + 8))();
        }
        if (properties._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.vendorID,
                     (VkBuffer)properties._0_8_);
        }
        uVar56 = uVar56 + 1;
        lVar51 = lVar51 + 6;
      } while (uVar39 != uVar56);
    }
  }
  else {
    pIVar26 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar27 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    (*pIVar26->_vptr_InstanceInterface[5])(pIVar26,pVVar27,&properties);
    uVar56 = 0;
    if (uVar39 != 0) {
      piVar38 = (int *)((long)pvVar24 + 8);
      uVar37 = 0;
      do {
        iVar33 = (int)uVar56;
        iVar47 = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar37];
        if ((0 < (int)properties.limits.minStorageBufferOffsetAlignment) &&
           ((iVar33 / (int)properties.limits.minStorageBufferOffsetAlignment) *
            (int)properties.limits.minStorageBufferOffsetAlignment != iVar33)) {
          iVar33 = (iVar33 / (int)properties.limits.minStorageBufferOffsetAlignment + 1) *
                   (int)properties.limits.minStorageBufferOffsetAlignment;
        }
        piVar38[-2] = 0;
        piVar38[-1] = iVar33;
        *piVar38 = iVar47;
        uVar17 = iVar33 + iVar47;
        uVar56 = (ulong)uVar17;
        uVar37 = uVar37 + 1;
        piVar38 = piVar38 + 3;
      } while (uVar39 != uVar37);
      uVar56 = (ulong)(int)uVar17;
    }
    createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&expected,
                 (this->super_TestInstance).m_context,uVar56,0x20);
    allocateAndBindMemory
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&submitInfo,
               (this->super_TestInstance).m_context,_expected,(MemoryRequirement)0x1);
    pipelineLayoutParams._0_8_ = *(undefined8 *)(submitInfo._0_8_ + 0x18);
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&mapPtrs,(void **)&pipelineLayoutParams);
    if (uVar39 != 0) {
      lVar51 = 0;
      puVar28 = (uint *)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      do {
        uVar17 = *puVar28;
        uVar19 = *(uint *)((long)pvVar24 + lVar51 + 4);
        *(deUint64 *)
         ((long)&((descriptors.
                   super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->buffer).m_internal + lVar51 * 2) =
             _expected;
        *(ulong *)((long)&(descriptors.
                           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start)->offset + lVar51 * 2) =
             (ulong)uVar19;
        *(ulong *)((long)&(descriptors.
                           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start)->range + lVar51 * 2) =
             (ulong)uVar17;
        lVar51 = lVar51 + 0xc;
        puVar28 = puVar28 + 1;
      } while ((ulong)uVar39 * 0xc != lVar51);
    }
    pdVar29 = (deUint64 *)operator_new(0x20);
    pdVar29[2] = (deUint64)aDStack_360[0].m_device;
    pdVar29[3] = (deUint64)aDStack_360[0].m_allocator;
    *pdVar29 = _expected;
    pdVar29[1] = (deUint64)aDStack_360[0].m_deviceIface;
    _expected = 0;
    aDStack_360[0].m_deviceIface = (DeviceInterface *)0x0;
    aDStack_360[0].m_device = (VkDevice)0x0;
    aDStack_360[0].m_allocator = (VkAllocationCallbacks *)0x0;
    pipelineLayoutParams.pNext = (void *)0x0;
    pipelineLayoutParams._0_8_ = pdVar29;
    pipelineLayoutParams.pNext = operator_new(0x20);
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 0;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 0;
    *(undefined ***)pipelineLayoutParams.pNext = &PTR__SharedPtrState_00cef0f0;
    *(deUint64 **)((long)pipelineLayoutParams.pNext + 0x10) = pdVar29;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 1;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 1;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                *)&this->m_uniformBuffers,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)
               &pipelineLayoutParams);
    if (pipelineLayoutParams.pNext != (void *)0x0) {
      LOCK();
      piVar38 = (int *)((long)pipelineLayoutParams.pNext + 8);
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        pipelineLayoutParams._4_4_ = 0;
        (**(code **)(*pipelineLayoutParams.pNext + 0x10))();
      }
      LOCK();
      piVar38 = (int *)((long)pipelineLayoutParams.pNext + 0xc);
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if ((*piVar38 == 0) && (pipelineLayoutParams.pNext != (void *)0x0)) {
        (**(code **)(*pipelineLayoutParams.pNext + 8))();
      }
    }
    uVar12 = submitInfo._0_8_;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    uVar13 = submitInfo._0_8_;
    pipelineLayoutParams.pNext = (void *)0x0;
    submitInfo.sType = (VkStructureType)uVar12;
    submitInfo._4_4_ = SUB84(uVar12,4);
    pipelineLayoutParams.sType = submitInfo.sType;
    pipelineLayoutParams._4_4_ = submitInfo._4_4_;
    submitInfo._0_8_ = uVar13;
    pipelineLayoutParams.pNext = operator_new(0x20);
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 0;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 0;
    *(undefined ***)pipelineLayoutParams.pNext = &PTR__SharedPtrState_00cf0f58;
    *(undefined8 *)((long)pipelineLayoutParams.pNext + 0x10) = uVar12;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 1;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 1;
    std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
    emplace_back<de::SharedPtr<vk::Allocation>>
              ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                *)&this->m_uniformAllocs,(SharedPtr<vk::Allocation> *)&pipelineLayoutParams);
    if (pipelineLayoutParams.pNext != (void *)0x0) {
      LOCK();
      piVar38 = (int *)((long)pipelineLayoutParams.pNext + 8);
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        pipelineLayoutParams._4_4_ = 0;
        (**(code **)(*pipelineLayoutParams.pNext + 0x10))();
      }
      LOCK();
      piVar38 = (int *)((long)pipelineLayoutParams.pNext + 0xc);
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if ((*piVar38 == 0) && (pipelineLayoutParams.pNext != (void *)0x0)) {
        (**(code **)(*pipelineLayoutParams.pNext + 8))();
      }
    }
    if (submitInfo._0_8_ != 0) {
      (**(code **)(*(long *)submitInfo._0_8_ + 8))();
    }
    if (_expected != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(aDStack_360,_expected);
    }
  }
  if (0 < (int)uVar46) {
    uVar56 = 0;
    do {
      uVar56 = uVar56 + 1;
      ::vk::DescriptorSetUpdateBuilder::write
                (&setUpdateBuilder,(int)local_938,(void *)(uVar56 & 0xffffffff),0);
    } while ((uVar46 & 0x7fffffff) != uVar56);
  }
  pBVar6 = this->m_refLayout;
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::vector
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
             &properties,((long)pvVar50 - (long)pvVar24 >> 2) * -0x5555555555555555,
             (allocator_type *)&expected);
  pBVar44 = (pBVar6->blocks).
            super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pBVar6->blocks).
                              super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar44) >> 6)) {
    piVar38 = (int *)((long)pvVar24 + 8);
    lVar57 = 2;
    lVar51 = 0;
    lVar54 = 0;
    do {
      BVar59 = anon_unknown_15::getBlockDataPtr
                         ((BufferLayout *)
                          (pBVar6->bufferVars).
                          super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (BlockLayoutEntry *)((long)&(pBVar44->name)._M_dataplus._M_p + lVar51),
                          (void *)((long)piVar38[-1] +
                                  (long)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start[piVar38[-2]]),
                          *piVar38);
      *(void **)(properties._0_8_ + -8 + lVar57 * 4) = BVar59.ptr;
      *(long *)(properties._0_8_ + lVar57 * 4) = BVar59._8_8_;
      lVar54 = lVar54 + 1;
      pBVar44 = (pBVar6->blocks).
                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar57 = lVar57 + 4;
      piVar38 = piVar38 + 3;
      lVar51 = lVar51 + 0x40;
    } while (lVar54 < (int)((ulong)((long)(pBVar6->blocks).
                                          super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar44
                                   ) >> 6));
  }
  uVar13 = properties._16_8_;
  uVar12 = properties._0_8_;
  pBVar6 = this->m_refLayout;
  uVar46 = (uint)((ulong)((long)(pBVar6->blocks).
                                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pBVar6->blocks).
                               super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar46) {
    local_a28 = this->m_initialData;
    uVar56 = 0;
    do {
      pBVar44 = (pBVar6->blocks).
                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar7 = (local_a28->pointers).
               super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&properties,pBVar44[uVar56].name._M_dataplus._M_p,
                 (allocator<char> *)&expected);
      uVar39 = BufferLayout::getBlockIndex(pBVar6,(string *)&properties);
      if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
        operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
      }
      if (-1 < (int)uVar39) {
        piVar38 = *(int **)&pBVar44[uVar56].activeVarIndices.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if (piVar38 !=
            pBVar44[uVar56].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            iVar47 = *piVar38;
            pBVar58 = (pBVar6->bufferVars).
                      super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&properties,pBVar58[iVar47].name._M_dataplus._M_p,
                       (allocator<char> *)&expected);
            uVar17 = BufferLayout::getVariableIndex(pBVar6,(string *)&properties);
            if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
              operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
            }
            if (-1 < (int)uVar17) {
              anon_unknown_15::copyBufferVarData
                        ((pBVar6->bufferVars).
                         super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar17,
                         (BlockDataPtr *)((ulong)uVar39 * 0x10 + uVar12),pBVar58 + iVar47,
                         (BlockDataPtr *)pBVar7[uVar56].ptr);
            }
            piVar38 = piVar38 + 1;
          } while (piVar38 !=
                   pBVar44[uVar56].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != (uVar46 & 0x7fffffff));
  }
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    pSVar30 = (this->m_uniformAllocs).
              super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_uniformAllocs).
        super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar30) {
      lVar51 = 0;
      uVar56 = 0;
      do {
        lVar54 = *(long *)((long)&pSVar30->m_ptr + lVar51);
        ::vk::flushMappedMemoryRange
                  (vkd,device,(VkDeviceMemory)*(deUint64 *)(lVar54 + 8),
                   *(VkDeviceSize *)(lVar54 + 0x10),
                   (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar56]);
        uVar56 = uVar56 + 1;
        pSVar30 = (this->m_uniformAllocs).
                  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar51 = lVar51 + 0x10;
      } while (uVar56 < (ulong)((long)(this->m_uniformAllocs).
                                      super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar30 >>
                               4));
    }
  }
  else {
    uVar56 = 0;
    if ((long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar51 = (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      lVar54 = 0;
      do {
        uVar46 = (int)uVar56 +
                 bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar54];
        uVar56 = (ulong)uVar46;
        lVar54 = lVar54 + 1;
      } while (lVar51 + (ulong)(lVar51 == 0) != lVar54);
      uVar56 = (ulong)(int)uVar46;
    }
    pAVar8 = ((this->m_uniformAllocs).
              super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
    ::vk::flushMappedMemoryRange
              (vkd,device,(VkDeviceMemory)(pAVar8->m_memory).m_internal,pAVar8->m_offset,uVar56);
  }
  if (pvVar24 != (void *)0x0) {
    operator_delete(pvVar24,(long)local_af8 - (long)pvVar24);
  }
  if (mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorSetUpdateBuilder::update(&setUpdateBuilder,vkd,device);
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 1;
  pipelineLayoutParams.pSetLayouts = &local_8b8;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x0;
  ::vk::createPipelineLayout
            (&local_850,vkd,device,&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  properties._0_8_ = &properties.deviceType;
  std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"compute","");
  cVar31 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&properties);
  ::vk::createShaderModule(&local_790,vkd,device,*(ProgramBinary **)(cVar31._M_node + 2),0);
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x1d);
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((ulong)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  ::vk::createComputePipeline
            (&local_7b0,vkd,device,(VkPipelineCache)0x0,(VkComputePipelineCreateInfo *)&mapPtrs,
             (VkAllocationCallbacks *)0x0);
  ::vk::createCommandPool(&local_7d0,vkd,device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  ::vk::allocateCommandBuffer
            (&local_970,vkd,device,
             (VkCommandPool)
             local_7d0.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  cmdBufBeginParams.flags = 0;
  cmdBufBeginParams._20_4_ = 0;
  cmdBufBeginParams.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufBeginParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufBeginParams._4_4_ = 0;
  cmdBufBeginParams.pNext._0_4_ = 0;
  cmdBufBeginParams.pNext._4_4_ = 0;
  VVar18 = (*vkd->_vptr_DeviceInterface[0x49])
                     (vkd,local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar18,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x844);
  (*vkd->_vptr_DeviceInterface[0x4c])
            (vkd,local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             local_7b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  (*vkd->_vptr_DeviceInterface[0x56])
            (vkd,local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             local_850.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,0,1,
             &local_938,0,0);
  (*vkd->_vptr_DeviceInterface[0x5d])
            (vkd,local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,1);
  VVar18 = (*vkd->_vptr_DeviceInterface[0x4a])
                     (vkd,local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar18,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x84b);
  ::vk::createFence(&local_870,vkd,device,0,(VkAllocationCallbacks *)0x0);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_970;
  VVar18 = (*vkd->_vptr_DeviceInterface[2])
                     (vkd,local_a30,1,&submitInfo,
                      local_870.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                      m_internal);
  ::vk::checkResult(VVar18,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85c);
  VVar18 = (*vkd->_vptr_DeviceInterface[0x16])(vkd,device,1,&local_870,1,0xffffffffffffffff);
  ::vk::checkResult(VVar18,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85d);
  iVar47 = *(int *)local_a50[3];
  if (iVar47 != 1) {
    properties._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    pdVar42 = &properties.vendorID;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar42,"Error: ac_numPassed = ",0x16);
    std::ostream::operator<<(pdVar42,iVar47);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar42,", expected ",0xb);
    std::ostream::operator<<(pdVar42,1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar42);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  pBVar6 = this->m_refLayout;
  uVar46 = (uint)((ulong)((long)(pBVar6->blocks).
                                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pBVar6->blocks).
                               super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if ((int)uVar46 < 1) {
    bVar11 = true;
  }
  else {
    local_a40 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    pRVar9 = this->m_writeData;
    bVar11 = true;
    uVar56 = 0;
    do {
      local_a48 = (pBVar6->blocks).
                  super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pBVar7 = (pRVar9->pointers).
               super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&properties,local_a48[uVar56].name._M_dataplus._M_p,
                 (allocator<char> *)&expected);
      uVar39 = BufferLayout::getBlockIndex(pBVar6,(string *)&properties);
      if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
        operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
      }
      if (-1 < (int)uVar39) {
        local_a48 = local_a48 + uVar56;
        piVar38 = *(int **)&(local_a48->activeVarIndices).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if (piVar38 !=
            (local_a48->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          plVar32 = (long *)((ulong)uVar39 * 0x10 + uVar12);
          do {
            iVar33 = *piVar38;
            pBVar58 = (pBVar6->bufferVars).
                      super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&properties,pBVar58[iVar33].name._M_dataplus._M_p,
                       (allocator<char> *)&expected);
            uVar39 = BufferLayout::getVariableIndex(pBVar6,(string *)&properties);
            if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
              operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
            }
            if (-1 < (int)uVar39) {
              pBVar58 = pBVar58 + iVar33;
              pBVar10 = (pBVar6->bufferVars).
                        super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar33 = pBVar10[uVar39].offset;
              lVar51 = *plVar32;
              iVar2 = pBVar58->offset;
              pvVar24 = pBVar7[uVar56].ptr;
              scalarType = glu::getDataTypeScalarType(pBVar58->type);
              local_a14 = glu::getDataTypeScalarSize(pBVar10[uVar39].type);
              DVar3 = pBVar10[uVar39].type;
              uVar17 = *(uint *)((long)plVar32 + 0xc);
              uVar19 = pBVar10[uVar39].topLevelArraySize;
              if (pBVar10[uVar39].topLevelArraySize == 0) {
                uVar19 = uVar17;
              }
              if (0 < (int)uVar19) {
                local_a0c = pBVar10[uVar39].arrayStride;
                local_a18 = pBVar10[uVar39].topLevelArrayStride;
                local_a10 = pBVar58->arrayStride;
                if (pBVar10[uVar39].arraySize != 0) {
                  uVar17 = pBVar10[uVar39].arraySize;
                }
                local_a1c = pBVar58->topLevelArrayStride;
                local_ac0 = 0;
                local_b1c = 0;
                local_a38 = pBVar58;
                do {
                  if (0 < (int)uVar17) {
                    iVar34 = (int)local_ac0;
                    iVar20 = local_a18 * iVar34;
                    iVar21 = local_a1c * iVar34;
                    uVar37 = 0;
                    do {
                      pdVar42 = &properties.vendorID;
                      iVar35 = (int)uVar37;
                      ref = (void *)((long)(local_a0c * iVar35) + (long)iVar20 + iVar33 + lVar51);
                      pvVar50 = (void *)((long)pvVar24 +
                                        (long)(local_a10 * iVar35) + (long)iVar21 + (long)iVar2);
                      iVar14 = local_b1c;
                      if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
                        iVar22 = glu::getDataTypeMatrixNumRows(pBVar10[uVar39].type);
                        iVar23 = glu::getDataTypeMatrixNumColumns(pBVar10[uVar39].type);
                        if (0 < iVar23) {
                          bVar16 = pBVar10[uVar39].isRowMajor;
                          iVar4 = pBVar10[uVar39].matrixStride;
                          bVar1 = pBVar58->isRowMajor;
                          iVar43 = pBVar58->matrixStride;
                          bVar15 = true;
                          iVar41 = 0;
                          iVar53 = 0;
                          iVar49 = 0;
                          iVar45 = 0;
                          local_a30 = (VkQueue)CONCAT44(local_a30._4_4_,iVar23);
                          local_a28 = (RefDataStorage *)CONCAT44(local_a28._4_4_,iVar43);
                          do {
                            iVar23 = iVar22;
                            iVar40 = iVar41;
                            iVar52 = iVar53;
                            iVar48 = iVar49;
                            iVar55 = iVar49;
                            if (0 < iVar22) {
                              do {
                                if (bVar15 == false) {
                                  bVar15 = false;
                                }
                                else {
                                  iVar43 = iVar40;
                                  if ((bVar1 & 1U) != 0) {
                                    iVar43 = iVar55;
                                  }
                                  iVar36 = iVar52;
                                  if ((bVar16 & 1U) != 0) {
                                    iVar36 = iVar48;
                                  }
                                  bVar15 = anon_unknown_15::compareComponents
                                                     (scalarType,(void *)((long)iVar36 + (long)ref),
                                                      (void *)((long)iVar43 + (long)pvVar50),1);
                                  iVar43 = (int)local_a28;
                                }
                                iVar48 = iVar48 + iVar4;
                                iVar52 = iVar52 + 4;
                                iVar40 = iVar40 + 4;
                                iVar55 = iVar55 + iVar43;
                                iVar23 = iVar23 + -1;
                              } while (iVar23 != 0);
                            }
                            iVar45 = iVar45 + 1;
                            iVar49 = iVar49 + 4;
                            iVar53 = iVar53 + iVar4;
                            iVar41 = iVar41 + iVar43;
                          } while (iVar45 != (int)local_a30);
                          pBVar58 = local_a38;
                          if (bVar15 == false) {
                            pdVar42 = &properties.vendorID;
                            iVar14 = local_b1c + 1;
                            if (local_b1c + 1 < 3) {
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)&expected)
                              ;
                              pBVar58 = local_a38;
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&bufferSizes);
                              anon_unknown_15::generateImmMatrixSrc
                                        ((ostream *)&expected,pBVar58->type,pBVar58->matrixStride,
                                         pBVar58->isRowMajor,pvVar50);
                              anon_unknown_15::generateImmMatrixSrc
                                        ((ostream *)&bufferSizes,pBVar10[uVar39].type,
                                         pBVar10[uVar39].matrixStride,pBVar10[uVar39].isRowMajor,ref
                                        );
                              properties._0_8_ = local_a40;
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar42);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,"ERROR: mismatch in ",0x13);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,(pBVar58->name)._M_dataplus._M_p,
                                         (pBVar58->name)._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,", top-level ndx ",0x10);
                              std::ostream::operator<<(pdVar42,iVar34);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,", bottom-level ndx ",0x13);
                              std::ostream::operator<<(pdVar42,iVar35);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,":\n",2);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,"  expected ",0xb);
                              std::__cxx11::stringbuf::str();
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,(char *)local_a70,local_a68);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,"  got ",6);
                              std::__cxx11::stringbuf::str();
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pdVar42,(char *)local_a90,local_a88);
                              tcu::MessageBuilder::operator<<
                                        ((MessageBuilder *)&properties,
                                         (EndMessageToken *)&tcu::TestLog::EndMessage);
                              if (local_a90 != local_a80) {
                                operator_delete(local_a90,local_a80[0] + 1);
                              }
                              if (local_a70 != local_a60) {
                                operator_delete(local_a70,local_a60[0] + 1);
                              }
                              goto LAB_0069765f;
                            }
                          }
                        }
                      }
                      else {
                        bVar16 = anon_unknown_15::compareComponents
                                           (scalarType,ref,pvVar50,local_a14);
                        if ((!bVar16) && (iVar14 = local_b1c + 1, local_b1c + 1 < 3)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&expected);
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufferSizes);
                          anon_unknown_15::generateImmScalarVectorSrc
                                    ((ostream *)&expected,pBVar58->type,pvVar50);
                          anon_unknown_15::generateImmScalarVectorSrc
                                    ((ostream *)&bufferSizes,pBVar10[uVar39].type,ref);
                          properties._0_8_ = local_a40;
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar42);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,"ERROR: mismatch in ",0x13);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,(pBVar58->name)._M_dataplus._M_p,
                                     (pBVar58->name)._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,", top-level ndx ",0x10);
                          std::ostream::operator<<(pdVar42,iVar34);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,", bottom-level ndx ",0x13);
                          std::ostream::operator<<(pdVar42,iVar35);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,":\n",2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,"  expected ",0xb);
                          std::__cxx11::stringbuf::str();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,(char *)local_a70,local_a68);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,"\n",1);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,"  got ",6);
                          std::__cxx11::stringbuf::str();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pdVar42,(char *)local_a90,local_a88);
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)&properties,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
                          if (local_a90 != local_a80) {
                            operator_delete(local_a90,local_a80[0] + 1);
                          }
                          if (local_a70 != local_a60) {
                            operator_delete(local_a70,local_a60[0] + 1);
                          }
LAB_0069765f:
                          local_b1c = local_b1c + 1;
                          std::__cxx11::ostringstream::~ostringstream
                                    ((ostringstream *)&properties.vendorID);
                          std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufferSizes)
                          ;
                          std::ios_base::~ios_base(local_180);
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&expected);
                          std::ios_base::~ios_base(local_2f8);
                          iVar14 = local_b1c;
                        }
                      }
                      local_b1c = iVar14;
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar17);
                  }
                  pdVar42 = &properties.vendorID;
                  local_ac0 = local_ac0 + 1;
                } while (local_ac0 != uVar19);
                if (local_b1c < 3) {
                  bVar11 = (bool)(local_b1c == 0 & bVar11);
                }
                else {
                  properties._0_8_ = local_a40;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar42);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar42,"... (",5);
                  std::ostream::operator<<(pdVar42,local_b1c);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pdVar42," failures for ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pdVar42,(pBVar58->name)._M_dataplus._M_p,
                             (pBVar58->name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pdVar42," in total)",10);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&properties,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar42);
                  std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
                  bVar11 = false;
                }
              }
            }
            piVar38 = piVar38 + 1;
          } while (piVar38 !=
                   (local_a48->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 != (uVar46 & 0x7fffffff));
  }
  if ((iVar47 == 1) && (bVar11)) {
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&properties,"Result comparison and counter values are OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
               properties._8_8_ + properties._0_8_);
  }
  else if (iVar47 == 1 && !bVar11) {
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&properties,"Result comparison failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
               properties._8_8_ + properties._0_8_);
  }
  else {
    properties._0_8_ = &properties.deviceType;
    if ((bool)~bVar11 || iVar47 == 1) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&properties,"Result comparison and counter values are incorrect","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
                 properties._8_8_ + properties._0_8_);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&properties,"Counter value incorrect","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
                 properties._8_8_ + properties._0_8_);
    }
  }
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  if (local_870.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&local_870.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
               (VkFence)local_870.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                        m_internal);
  }
  if (local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    properties._0_8_ = local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_970.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (local_7d0.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_7d0.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_7d0.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  if (local_7b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_7b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_7b0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_790.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&local_790.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkShaderModule)
               local_790.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  if (local_850.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&local_850.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               local_850.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  if (uVar12 != 0) {
    operator_delete((void *)uVar12,uVar13 - uVar12);
  }
  if (descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descriptors.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descriptors.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descriptors.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setUpdateBuilder.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setUpdateBuilder.m_copies.
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setUpdateBuilder.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setUpdateBuilder.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setUpdateBuilder.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setUpdateBuilder.m_writes.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setUpdateBuilder.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setUpdateBuilder.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector(&setUpdateBuilder.m_writeDescriptorInfos);
  if (local_938 != 0) {
    properties.apiVersion = (undefined4)local_938;
    properties.driverVersion = local_938._4_4_;
    (**(code **)(*plStack_930 + 0x1e8))(plStack_930,_local_928,acStack_920,1);
  }
  if (local_898.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_890,local_898);
  }
  if (local_8b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_8b0,local_8b8);
  }
  if (poolBuilder.m_counts.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(poolBuilder.m_counts.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)poolBuilder.m_counts.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)poolBuilder.m_counts.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setLayoutBuilder.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setLayoutBuilder.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setLayoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setLayoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setLayoutBuilder.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setLayoutBuilder.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setLayoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setLayoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setLayoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setLayoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setLayoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setLayoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a50 != (long *)0x0) {
    (**(code **)(*local_a50 + 8))();
  }
  if (local_770.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_770.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_770.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SSBOLayoutCaseInstance::iterate (void)
{
	// todo: add compute stage availability check
	const vk::DeviceInterface&	vk					= m_context.getDeviceInterface();
	const vk::VkDevice			device				= m_context.getDevice();
	const vk::VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Create descriptor set
	const deUint32 acBufferSize = 1024;
	vk::Move<vk::VkBuffer> acBuffer (createBuffer(m_context, acBufferSize, vk:: VK_BUFFER_USAGE_STORAGE_BUFFER_BIT));
	de::UniquePtr<vk::Allocation> acBufferAlloc (allocateAndBindMemory(m_context, *acBuffer, vk::MemoryRequirement::HostVisible));

	deMemset(acBufferAlloc->getHostPtr(), 0, acBufferSize);
	flushMappedMemoryRange(vk, device, acBufferAlloc->getMemory(), acBufferAlloc->getOffset(), acBufferSize);

	vk::DescriptorSetLayoutBuilder setLayoutBuilder;
	vk::DescriptorPoolBuilder poolBuilder;

	setLayoutBuilder
		.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);

	int numBlocks = 0;
	const int numBindings = m_interface.getNumBlocks();
	for (int bindingNdx = 0; bindingNdx < numBindings; bindingNdx++)
	{
		const BufferBlock& block = m_interface.getBlock(bindingNdx);
		if (block.isArray())
		{
			setLayoutBuilder
				.addArrayBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, block.getArraySize(), vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += block.getArraySize();
		}
		else
		{
			setLayoutBuilder
				.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += 1;
		}
	}

	poolBuilder
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)(1 + numBlocks));

	const vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(setLayoutBuilder.build(vk, device));
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(poolBuilder.build(vk, device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const vk::VkDescriptorSetAllocateInfo allocInfo =
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		*descriptorPool,
		1u,
		&descriptorSetLayout.get(),
	};

	const vk::Unique<vk::VkDescriptorSet> descriptorSet(allocateDescriptorSet(vk, device, &allocInfo));
	const vk::VkDescriptorBufferInfo descriptorInfo = makeDescriptorBufferInfo(*acBuffer, 0ull, acBufferSize);

	vk::DescriptorSetUpdateBuilder setUpdateBuilder;
	std::vector<vk::VkDescriptorBufferInfo>	descriptors(numBlocks);

	setUpdateBuilder
		.writeSingle(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo);

	vector<BlockDataPtr>  mappedBlockPtrs;

	// Upload base buffers
	{
		const std::vector<int>			bufferSizes		= computeBufferSizes(m_interface, m_refLayout);
		std::vector<void*>				mapPtrs;
		std::vector<BlockLocation>		blockLocations	(numBlocks);

		DE_ASSERT(bufferSizes.size() == m_refLayout.blocks.size());

		if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
		{
			mapPtrs.resize(numBlocks);
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				blockLocations[blockNdx] = BlockLocation(blockNdx, 0, bufferSize);

				vk::Move<vk::VkBuffer>				buffer		= createBuffer(m_context, bufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
				de::MovePtr<vk::Allocation>			alloc		= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, 0ull, bufferSize);

				mapPtrs[blockNdx] = alloc->getHostPtr();

				m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
				m_uniformAllocs.push_back(AllocationSp(alloc.release()));
			}
		}
		else
		{
			DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);

			vk::VkPhysicalDeviceProperties properties;
			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &properties);
			const int	bindingAlignment	= (int)properties.limits.minStorageBufferOffsetAlignment;
			int			curOffset			= 0;
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				if (bindingAlignment > 0)
					curOffset = deRoundUp32(curOffset, bindingAlignment);

				blockLocations[blockNdx] = BlockLocation(0, curOffset, bufferSize);
				curOffset += bufferSize;
			}

			const int						totalBufferSize = curOffset;
			vk::Move<vk::VkBuffer>			buffer			= createBuffer(m_context, totalBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
			de::MovePtr<vk::Allocation>		alloc			= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

			mapPtrs.push_back(alloc->getHostPtr());

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32						bufferSize	= bufferSizes[blockNdx];
				const deUint32						offset		= blockLocations[blockNdx].offset;

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, offset, bufferSize);
			}

			m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
			m_uniformAllocs.push_back(AllocationSp(alloc.release()));
		}

		// Update remaining bindings
		{
			int blockNdx = 0;
			for (int bindingNdx = 0; bindingNdx < numBindings; ++bindingNdx)
			{
				const BufferBlock&	block				= m_interface.getBlock(bindingNdx);
				const int			numBlocksInBinding	= (block.isArray() ? block.getArraySize() : 1);

				setUpdateBuilder.writeArray(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(bindingNdx + 1),
					vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, numBlocksInBinding, &descriptors[blockNdx]);

				blockNdx += numBlocksInBinding;
			}
		}

		// Copy the initial data to the storage buffers
		{
			mappedBlockPtrs = blockLocationsToPtrs(m_refLayout, blockLocations, mapPtrs);
			copyData(m_refLayout, mappedBlockPtrs, m_refLayout, m_initialData.pointers);

			if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
			{
				DE_ASSERT(m_uniformAllocs.size() == bufferSizes.size());
				for (size_t allocNdx = 0; allocNdx < m_uniformAllocs.size(); allocNdx++)
				{
					const int size = bufferSizes[allocNdx];
					vk::Allocation* alloc = m_uniformAllocs[allocNdx].get();
					flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), size);
				}
			}
			else
			{
				DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);
				DE_ASSERT(m_uniformAllocs.size() == 1);
				int totalSize = 0;
				for (size_t bufferNdx = 0; bufferNdx < bufferSizes.size(); bufferNdx++)
				{
					totalSize += bufferSizes[bufferNdx];
				}

				DE_ASSERT(totalSize > 0);
				vk::Allocation* alloc = m_uniformAllocs[0].get();
				flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), totalSize);
			}
		}
	}

	setUpdateBuilder.update(vk, device);

	const vk::VkPipelineLayoutCreateInfo pipelineLayoutParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(vk::VkPipelineLayoutCreateFlags)0,
		1u,													// deUint32						descriptorSetCount;
		&*descriptorSetLayout,								// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	vk::Move<vk::VkPipelineLayout> pipelineLayout(createPipelineLayout(vk, device, &pipelineLayoutParams));

	vk::Move<vk::VkShaderModule> shaderModule (createShaderModule(vk, device, m_context.getBinaryCollection().get("compute"), 0));
	const vk::VkPipelineShaderStageCreateInfo pipelineShaderStageParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		(vk::VkPipelineShaderStageCreateFlags)0,
		vk::VK_SHADER_STAGE_COMPUTE_BIT,						// VkShaderStage				stage;
		*shaderModule,											// VkShader						shader;
		"main",													//
		DE_NULL,												// const VkSpecializationInfo*	pSpecializationInfo;
	};
	const vk::VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		vk::VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0,													// VkPipelineCreateFlags			flags;
		pipelineShaderStageParams,							// VkPipelineShaderStageCreateInfo	stage;
		*pipelineLayout,									// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};
	vk::Move<vk::VkPipeline> pipeline(createComputePipeline(vk, device, DE_NULL, &pipelineCreateInfo));

	vk::Move<vk::VkCommandPool> cmdPool (createCommandPool(vk, device, vk::VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	vk::Move<vk::VkCommandBuffer> cmdBuffer (allocateCommandBuffer(vk, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const vk::VkCommandBufferBeginInfo cmdBufBeginParams =
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//	VkStructureType				sType;
		DE_NULL,											//	const void*					pNext;
		0u,													//	VkCmdBufferOptimizeFlags	flags;
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams));

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, 1, 1, 1);

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	vk::Move<vk::VkFence> fence (createFence(vk, device));

	const vk::VkSubmitInfo  submitInfo  =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const vk::VkSemaphore*)DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1u,
		&cmdBuffer.get(),
		0u,
		(const vk::VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));

	// Read back ac_numPassed data
	bool counterOk;
	{
		const int refCount = 1;
		int resCount = 0;

		resCount = *(const int*)((const deUint8*)acBufferAlloc->getHostPtr());

		counterOk = (refCount == resCount);
		if (!counterOk)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "Error: ac_numPassed = " << resCount << ", expected " << refCount << TestLog::EndMessage;
		}
	}

	// Validate result
	const bool compareOk = compareData(m_context.getTestContext().getLog(), m_refLayout, m_writeData.pointers, m_refLayout, mappedBlockPtrs);

	if (compareOk && counterOk)
		return tcu::TestStatus::pass("Result comparison and counter values are OK");
	else if (!compareOk && counterOk)
		return tcu::TestStatus::fail("Result comparison failed");
	else if (compareOk && !counterOk)
		return tcu::TestStatus::fail("Counter value incorrect");
	else
		return tcu::TestStatus::fail("Result comparison and counter values are incorrect");
}